

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void LogPrintf_<char[12],char_const*>
               (string_view logging_function,string_view source_file,int source_line,LogFlags flag,
               Level level,char *fmt,char (*args) [12],char **args_1)

{
  long lVar1;
  bool bVar2;
  Logger *pLVar3;
  undefined4 in_register_00000084;
  char (*args_1_00) [12];
  long in_FS_OFFSET;
  string_view str;
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  args_1_00 = (char (*) [12])CONCAT44(in_register_00000084,source_line);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::Enabled(pLVar3);
  if (bVar2) {
    log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
    log_msg._M_string_length = 0;
    log_msg.field_2._M_local_buf[0] = '\0';
    tinyformat::format<char[12],char_const*>
              (&local_70,(tinyformat *)"%s: Serialize or I/O error - %s\n","SerializeDB",
               (char (*) [12])CONCAT44(in_register_00000084,source_line),(char **)args_1_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&log_msg,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pLVar3 = LogInstance();
    str._M_str = log_msg._M_dataplus._M_p;
    str._M_len = log_msg._M_string_length;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x2d,ALL,Error);
    std::__cxx11::string::~string((string *)&log_msg);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void LogPrintf_(std::string_view logging_function, std::string_view source_file, const int source_line, const BCLog::LogFlags flag, const BCLog::Level level, const char* fmt, const Args&... args)
{
    if (LogInstance().Enabled()) {
        std::string log_msg;
        try {
            log_msg = tfm::format(fmt, args...);
        } catch (tinyformat::format_error& fmterr) {
            /* Original format string will have newline so don't add one here */
            log_msg = "Error \"" + std::string(fmterr.what()) + "\" while formatting log message: " + fmt;
        }
        LogInstance().LogPrintStr(log_msg, logging_function, source_file, source_line, flag, level);
    }
}